

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

int omp_get_num_devices(void)

{
  size_type sVar1;
  size_t Devices_size;
  
  std::mutex::lock((mutex *)Devices_size);
  sVar1 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::size(&Devices);
  std::mutex::unlock((mutex *)0x1024f9);
  return (int)sVar1;
}

Assistant:

EXTERN int omp_get_num_devices(void) {
  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();

  DP("Call to omp_get_num_devices returning %zd\n", Devices_size);

  return Devices_size;
}